

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  undefined1 local_50 [8];
  DumpState D;
  int strip_local;
  void *data_local;
  lua_Writer w_local;
  Proto *f_local;
  lua_State *L_local;
  
  D.data._4_4_ = 0;
  local_50 = (undefined1  [8])L;
  D.L = (lua_State *)w;
  D.writer = (lua_Writer)data;
  D.data._0_4_ = strip;
  D.status = strip;
  dumpHeader((DumpState *)local_50);
  dumpByte((DumpState *)local_50,f->sizeupvalues);
  dumpFunction((DumpState *)local_50,f,(TString *)0x0);
  return D.data._4_4_;
}

Assistant:

int luaU_dump(lua_State *L, const Proto *f, lua_Writer w, void *data,
              int strip) {
  DumpState D;
  D.L = L;
  D.writer = w;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f, NULL);
  return D.status;
}